

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary.cc
# Opt level: O1

void LabelDict::add_example_namespace(example *ec,namespace_index ns,features *fs)

{
  uchar *puVar1;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  namespace_index local_41;
  example *local_40;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  puVar1 = (ec->super_example_predict).indices._begin;
  lVar5 = (long)(ec->super_example_predict).indices._end - (long)puVar1;
  if (lVar5 != 0) {
    lVar6 = 0;
    do {
      if (puVar1[lVar6] == ns) goto LAB_002633de;
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  local_41 = ns;
  v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec,&local_41);
LAB_002633de:
  pfVar4 = (fs->values)._begin;
  local_40 = ec;
  if ((fs->values)._end != pfVar4) {
    psVar2 = (fs->space_names)._end;
    psVar3 = (fs->space_names)._begin;
    local_38 = &(ec->super_example_predict).feature_space[ns].space_names;
    lVar5 = 0;
    uVar7 = 0;
    do {
      features::push_back((ec->super_example_predict).feature_space + ns,pfVar4[uVar7],
                          (fs->indicies)._begin[uVar7]);
      if (psVar2 != psVar3) {
        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back(local_38,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&(((fs->space_names)._begin)->
                                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr + lVar5));
      }
      uVar7 = uVar7 + 1;
      pfVar4 = (fs->values)._begin;
      lVar5 = lVar5 + 0x10;
    } while (uVar7 < (ulong)((long)(fs->values)._end - (long)pfVar4 >> 2));
  }
  local_40->total_sum_feat_sq = fs->sum_feat_sq + local_40->total_sum_feat_sq;
  local_40->num_features =
       local_40->num_features + ((long)(fs->values)._end - (long)(fs->values)._begin >> 2);
  return;
}

Assistant:

void add_example_namespace(example& ec, namespace_index ns, features& fs)
{
  bool has_ns = false;
  for (size_t i = 0; i < ec.indices.size(); i++)
    if (ec.indices[i] == (size_t)ns)
    {
      has_ns = true;
      break;
    }

  if (!has_ns)
    ec.indices.push_back((size_t)ns);

  bool audit = fs.space_names.size() > 0;
  features& add_fs = ec.feature_space[(size_t)ns];
  for (size_t i = 0; i < fs.size(); ++i)
  {
    add_fs.push_back(fs.values[i], fs.indicies[i]);
    if (audit)
      add_fs.space_names.push_back(fs.space_names[i]);
  }
  ec.total_sum_feat_sq += fs.sum_feat_sq;

  ec.num_features += fs.size();
}